

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::queryTest<true>(ViewTest *this)

{
  undefined1 *puVar1;
  allocator<int> *paVar2;
  size_t sVar3;
  reference pvVar4;
  iterator iVar5;
  iterator iVar6;
  bool local_291;
  bool local_251;
  bool local_219;
  bool local_1e9;
  bool local_1ca;
  allocator<int> local_1c9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1c8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1c0;
  undefined1 local_1b8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_170 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  undefined1 local_140 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  undefined1 local_c8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_80 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  allocator<int> local_51;
  undefined1 local_50 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v;
  ViewTest *this_local;
  
  v.geometry_._48_8_ = this;
  std::allocator<int>::allocator(&local_51);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_50,&this->scalar_,&local_51);
  std::allocator<int>::~allocator(&local_51);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_50);
  local_1e9 = false;
  if (sVar3 == 0) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_50);
    local_1e9 = sVar3 == 1;
  }
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = local_1e9;
  test((bool *)((long)&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_50);
  puVar1 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80,1,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80,0);
  *pvVar4 = 0x18;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  paVar2 = (allocator<int> *)
           ((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_c8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar2);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
  local_219 = false;
  if (sVar3 == 1) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
    local_219 = false;
    if (sVar3 == 0x18) {
      sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8,0);
      local_219 = sVar3 == 0x18;
    }
  }
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_219;
  test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  puVar1 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,0);
  *pvVar4 = 4;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,1);
  *pvVar4 = 6;
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
  paVar2 = (allocator<int> *)
           ((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_140,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar2);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_140);
  local_251 = false;
  if (sVar3 == 2) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_140);
    local_251 = false;
    if (sVar3 == 0x18) {
      sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_140,0);
      local_251 = false;
      if (sVar3 == 4) {
        sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_140,1);
        local_251 = sVar3 == 6;
      }
    }
  }
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_251;
  test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_140);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
  puVar1 = &v_3.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_170,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_3.geometry_.field_0x37);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_170,0);
  *pvVar4 = 3;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_170,1);
  *pvVar4 = 4;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_170,2);
  *pvVar4 = 2;
  local_1c0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_170);
  local_1c8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_170);
  std::allocator<int>::allocator(&local_1c9);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_1b8,local_1c0,local_1c8,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_1c9);
  std::allocator<int>::~allocator(&local_1c9);
  sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8);
  local_291 = false;
  if (sVar3 == 3) {
    sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8);
    local_291 = false;
    if (sVar3 == 0x18) {
      sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8,0);
      local_291 = false;
      if (sVar3 == 3) {
        sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8,1);
        local_291 = false;
        if (sVar3 == 4) {
          sVar3 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8,2);
          local_291 = sVar3 == 2;
        }
      }
    }
  }
  local_1ca = local_291;
  test(&local_1ca);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_170);
  return;
}

Assistant:

void ViewTest::queryTest(){
    // scalar
    {
        andres::View<int, constTarget> v(&scalar_);
        test(v.dimension()== 0 &&
               v.size()== 1);
    }
    // 1D
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

        test(v.dimension()==1 && 
               v.size()==24 &&
               v.shape(0)==24);
    }
    // 2D 
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 4;
        shape[1] = 6; 
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

        test(v.dimension()== 2 &&
               v.size()== 24 &&
               v.shape(0)== 4 &&
               v.shape(1)== 6); 
    }
    // 3D
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

        test(v.dimension()== 3 &&
               v.size()== 24 && 
               v.shape(0)== 3 && 
               v.shape(1)== 4 &&
               v.shape(2)== 2);
    }
}